

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
* __thiscall
phmap::priv::
btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
::operator=(btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
            *this,btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                  *x)

{
  btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *x_local;
  btree<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *this_local;
  
  if (this != x) {
    clear(this);
    key_comp(x);
    mutable_key_comp(this);
    btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,false>>
    ::
    copy_or_move_values_in_order<phmap::priv::btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,false>>const>
              ((btree<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,false>>
                *)this,x);
  }
  return this;
}

Assistant:

auto btree<P>::operator=(const btree &x) -> btree & {
        if (this != &x) {
            clear();

            *mutable_key_comp() = x.key_comp();
            if (phmap::allocator_traits<
                allocator_type>::propagate_on_container_copy_assignment::value) {
                *mutable_allocator() = x.allocator();
            }

            copy_or_move_values_in_order(&x);
        }
        return *this;
    }